

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

DataBuffer * __thiscall
sglr::ReferenceContext::getBufferBinding(ReferenceContext *this,deUint32 target)

{
  VertexArray *local_38;
  VertexArray *vertexArrayObject;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  if (this->m_vertexArrayBinding == (VertexArray *)0x0) {
    local_38 = &this->m_clientVertexArray;
  }
  else {
    local_38 = this->m_vertexArrayBinding;
  }
  if (target == 0x8892) {
    this_local = (ReferenceContext *)this->m_arrayBufferBinding;
  }
  else if (target == 0x8893) {
    this_local = (ReferenceContext *)local_38->m_elementArrayBufferBinding;
  }
  else if (target == 0x88eb) {
    this_local = (ReferenceContext *)this->m_pixelPackBufferBinding;
  }
  else if (target == 0x88ec) {
    this_local = (ReferenceContext *)this->m_pixelUnpackBufferBinding;
  }
  else if (target == 0x8a11) {
    this_local = (ReferenceContext *)this->m_uniformBufferBinding;
  }
  else if (target == 0x8c8e) {
    this_local = (ReferenceContext *)this->m_transformFeedbackBufferBinding;
  }
  else if (target == 0x8f36) {
    this_local = (ReferenceContext *)this->m_copyReadBufferBinding;
  }
  else if (target == 0x8f37) {
    this_local = (ReferenceContext *)this->m_copyWriteBufferBinding;
  }
  else if (target == 0x8f3f) {
    this_local = (ReferenceContext *)this->m_drawIndirectBufferBinding;
  }
  else {
    this_local = (ReferenceContext *)0x0;
  }
  return (DataBuffer *)this_local;
}

Assistant:

DataBuffer* ReferenceContext::getBufferBinding (deUint32 target) const
{
	const VertexArray* vertexArrayObject = (m_vertexArrayBinding) ? (m_vertexArrayBinding) : (&m_clientVertexArray);

	switch (target)
	{
		case GL_ARRAY_BUFFER:				return m_arrayBufferBinding;
		case GL_COPY_READ_BUFFER:			return m_copyReadBufferBinding;
		case GL_COPY_WRITE_BUFFER:			return m_copyWriteBufferBinding;
		case GL_DRAW_INDIRECT_BUFFER:		return m_drawIndirectBufferBinding;
		case GL_ELEMENT_ARRAY_BUFFER:		return vertexArrayObject->m_elementArrayBufferBinding;
		case GL_PIXEL_PACK_BUFFER:			return m_pixelPackBufferBinding;
		case GL_PIXEL_UNPACK_BUFFER:		return m_pixelUnpackBufferBinding;
		case GL_TRANSFORM_FEEDBACK_BUFFER:	return m_transformFeedbackBufferBinding;
		case GL_UNIFORM_BUFFER:				return m_uniformBufferBinding;
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}